

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::optimizeBoolean(OptimizeInstructions *this,Expression *boolean)

{
  uint uVar1;
  ulong uVar2;
  uintptr_t uVar3;
  int *piVar4;
  undefined4 uVar5;
  bool bVar6;
  Id IVar7;
  Index bits;
  Expression *pEVar8;
  anon_union_16_5_9943fe1e_for_Literal_0 *this_00;
  ulong uVar9;
  ulong uVar10;
  Literal *this_01;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_120;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_f8;
  anon_union_16_5_9943fe1e_for_Literal_0 local_e8;
  undefined8 local_d8;
  long local_c8;
  anon_union_16_5_9943fe1e_for_Literal_0 local_a8;
  long local_98;
  Expression **local_88;
  anon_union_16_5_9943fe1e_for_Literal_0 local_68;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_58;
  Expression *local_40;
  Expression *extended;
  int32_t leftShift;
  int32_t rightShift;
  
  IVar7 = boolean->_id;
  if (boolean != (Expression *)0x0 && IVar7 == UnaryId) {
    if (boolean[1]._id != MemorySizeId) {
      return boolean;
    }
    pEVar8 = (Expression *)boolean[1].type.id;
    if (pEVar8->_id == BinaryId) {
      IVar7 = invertBinaryOp(this,pEVar8[1]._id);
      if (IVar7 == 0xcb) {
        return boolean;
      }
      pEVar8[1]._id = IVar7;
      return pEVar8;
    }
    if (pEVar8->_id != UnaryId) {
      return boolean;
    }
    if (pEVar8[1]._id != MemorySizeId) {
      return boolean;
    }
    return (Expression *)pEVar8[1].type.id;
  }
  if (IVar7 != BinaryId || boolean == (Expression *)0x0) {
    if (IVar7 == BlockId && boolean != (Expression *)0x0) {
      if ((boolean->type).id != 2) {
        return boolean;
      }
      uVar3 = boolean[2].type.id;
      if (uVar3 == 0) {
        return boolean;
      }
      pEVar8 = optimizeBoolean(this,*(Expression **)(*(long *)(boolean + 2) + -8 + uVar3 * 8));
      uVar3 = boolean[2].type.id;
      if (uVar3 != 0) {
        *(Expression **)(*(long *)(boolean + 2) + -8 + uVar3 * 8) = pEVar8;
        return boolean;
      }
      __assert_fail("usedElements > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                    ,0xd0,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    if (IVar7 == IfId && boolean != (Expression *)0x0) {
      if ((boolean->type).id != 2) {
        return boolean;
      }
      pEVar8 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
      boolean[1].type.id = (uintptr_t)pEVar8;
      pEVar8 = optimizeBoolean(this,*(Expression **)(boolean + 2));
      *(Expression **)(boolean + 2) = pEVar8;
      return boolean;
    }
    if (IVar7 != SelectId || boolean == (Expression *)0x0) {
      if (IVar7 != TryId || boolean == (Expression *)0x0) {
        return boolean;
      }
      if ((boolean->type).id != 2) {
        return boolean;
      }
      pEVar8 = optimizeBoolean(this,*(Expression **)(boolean + 2));
      *(Expression **)(boolean + 2) = pEVar8;
      if (*(long *)(boolean + 5) == 0) {
        return boolean;
      }
      uVar9 = 0;
      uVar10 = 1;
      do {
        pEVar8 = optimizeBoolean(this,*(Expression **)(boolean[4].type.id + uVar9 * 8));
        uVar2 = *(ulong *)(boolean + 5);
        if (uVar2 <= uVar9) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        *(Expression **)(boolean[4].type.id + uVar9 * 8) = pEVar8;
        bVar6 = uVar10 < uVar2;
        uVar9 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar6);
      return boolean;
    }
    pEVar8 = optimizeBoolean(this,*(Expression **)(boolean + 1));
    *(Expression **)(boolean + 1) = pEVar8;
    pEVar8 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
    boolean[1].type.id = (uintptr_t)pEVar8;
    return boolean;
  }
  IVar7 = boolean[1]._id;
  if ((int)IVar7 < 8) {
    if (IVar7 == BlockId) {
      piVar4 = (int *)boolean[1].type.id;
      if (*piVar4 == 0xe) {
        if (*(long *)(piVar4 + 8) != 2) {
LAB_007efa6c:
          __assert_fail("type == Type::i32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                        ,0x118,"int32_t wasm::Literal::geti32() const");
        }
        if (piVar4[4] == 0) {
          return *(Expression **)(boolean + 2);
        }
      }
    }
    else if ((IVar7 == SwitchId) && (**(int **)(boolean + 2) == 0xe)) {
      this_01 = (Literal *)(*(int **)(boolean + 2) + 4);
      bVar6 = Literal::isSignedMin(this_01);
      if (bVar6) {
LAB_007ef759:
        boolean[1]._id = CallIndirectId;
        bVar6 = Literal::isSignedMin(this_01);
        if (bVar6) {
          Literal::makeSignedMax((Literal *)&local_a8.func,(Type)0x2);
          Literal::operator=(this_01,(Literal *)&local_a8.func);
          this_00 = &local_a8;
        }
        else {
          Literal::abs((Literal *)&local_e8.func,(int)this_01);
          Literal::makeOne((Literal *)&local_68.func,(Type)0x2);
          Literal::sub((Literal *)&local_a8.func,(Literal *)&local_e8.func,(Literal *)&local_68.func
                      );
          Literal::operator=(this_01,(Literal *)&local_a8.func);
          Literal::~Literal((Literal *)&local_a8.func);
          Literal::~Literal((Literal *)&local_68.func);
          this_00 = &local_e8;
        }
        Literal::~Literal((Literal *)&this_00->func);
        return boolean;
      }
      Literal::abs((Literal *)&local_a8.func,(int)this_01);
      if (local_98 != 2) goto LAB_007efa6c;
      uVar5 = local_a8.i32;
      if (local_a8.i32 == 0) {
        Literal::~Literal((Literal *)&local_a8.func);
      }
      else {
        uVar1 = local_a8.i32 - 1;
        Literal::~Literal((Literal *)&local_a8.func);
        if ((uVar5 & uVar1) == 0) goto LAB_007ef759;
      }
    }
  }
  else if (IVar7 == LocalGetId) {
    pEVar8 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
    boolean[1].type.id = (uintptr_t)pEVar8;
    pEVar8 = optimizeBoolean(this,*(Expression **)(boolean + 2));
    *(Expression **)(boolean + 2) = pEVar8;
  }
  else if ((IVar7 == BinaryId) && (piVar4 = *(int **)(boolean + 2), *piVar4 == 0xe)) {
    if (*(long *)(piVar4 + 8) != 2) goto LAB_007efa6c;
    if (piVar4[4] == 0) {
      return (Expression *)boolean[1].type.id;
    }
  }
  if ((boolean->type).id == 2) {
    if (boolean->_id == UnaryId) {
      if (1 < boolean[1]._id - TableSizeId) {
        return boolean;
      }
      pEVar8 = (Expression *)boolean[1].type.id;
    }
    else {
      local_88 = &extended;
      extended._0_4_ = 0;
      local_c8 = (long)&extended + 4;
      extended._4_4_ = 0;
      local_f8.binder = &local_40;
      local_40 = (Expression *)0x0;
      local_120.submatchers.curr = &local_f8;
      local_120.submatchers.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
            *)&local_a8;
      local_98 = 0;
      local_a8.i64 = 0;
      local_58.curr = &local_120;
      local_120.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
      local_120.data = ShlInt32;
      local_58.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
            *)&local_e8;
      local_d8 = 0;
      local_e8.i64 = 0;
      local_68.i64 = 0;
      local_68._8_4_ = 0xb;
      if ((((boolean->_id != BinaryId) || (boolean[1]._id != GlobalSetId)) ||
          (bVar6 = Match::Internal::
                   Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
                   ::match((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                            )boolean,&local_58), !bVar6)) ||
         (((int)extended != extended._4_4_ || (pEVar8 = local_40, (int)extended == 0)))) {
        pEVar8 = (Expression *)0x0;
      }
    }
    if (pEVar8 != (Expression *)0x0) {
      bits = Properties::getSignExtBits(boolean);
      boolean = makeZeroExt(this,pEVar8,bits);
    }
  }
  return boolean;
}

Assistant:

Expression* optimizeBoolean(Expression* boolean) {
    // TODO use a general getFallthroughs
    if (auto* unary = boolean->dynCast<Unary>()) {
      if (unary) {
        if (unary->op == EqZInt32) {
          auto* unary2 = unary->value->dynCast<Unary>();
          if (unary2 && unary2->op == EqZInt32) {
            // double eqz
            return unary2->value;
          }
          if (auto* binary = unary->value->dynCast<Binary>()) {
            // !(x <=> y)   ==>   x <!=> y
            auto op = invertBinaryOp(binary->op);
            if (op != InvalidBinary) {
              binary->op = op;
              return binary;
            }
          }
        }
      }
    } else if (auto* binary = boolean->dynCast<Binary>()) {
      if (binary->op == SubInt32) {
        if (auto* c = binary->left->dynCast<Const>()) {
          if (c->value.geti32() == 0) {
            // bool(0 - x)   ==>   bool(x)
            return binary->right;
          }
        }
      } else if (binary->op == OrInt32) {
        // an or flowing into a boolean context can consider each input as
        // boolean
        binary->left = optimizeBoolean(binary->left);
        binary->right = optimizeBoolean(binary->right);
      } else if (binary->op == NeInt32) {
        if (auto* c = binary->right->dynCast<Const>()) {
          // x != 0 is just x if it's used as a bool
          if (c->value.geti32() == 0) {
            return binary->left;
          }
          // TODO: Perhaps use it for separate final pass???
          // x != -1   ==>    x ^ -1
          // if (num->value.geti32() == -1) {
          //   binary->op = XorInt32;
          //   return binary;
          // }
        }
      } else if (binary->op == RemSInt32) {
        // bool(i32(x) % C_pot)  ==>  bool(x & (C_pot - 1))
        // bool(i32(x) % min_s)  ==>  bool(x & max_s)
        if (auto* c = binary->right->dynCast<Const>()) {
          if (c->value.isSignedMin() ||
              Bits::isPowerOf2(c->value.abs().geti32())) {
            binary->op = AndInt32;
            if (c->value.isSignedMin()) {
              c->value = Literal::makeSignedMax(Type::i32);
            } else {
              c->value = c->value.abs().sub(Literal::makeOne(Type::i32));
            }
            return binary;
          }
        }
      }
      if (auto* ext = Properties::getSignExtValue(binary)) {
        // use a cheaper zero-extent, we just care about the boolean value
        // anyhow
        return makeZeroExt(ext, Properties::getSignExtBits(binary));
      }
    } else if (auto* block = boolean->dynCast<Block>()) {
      if (block->type == Type::i32 && block->list.size() > 0) {
        block->list.back() = optimizeBoolean(block->list.back());
      }
    } else if (auto* iff = boolean->dynCast<If>()) {
      if (iff->type == Type::i32) {
        iff->ifTrue = optimizeBoolean(iff->ifTrue);
        iff->ifFalse = optimizeBoolean(iff->ifFalse);
      }
    } else if (auto* select = boolean->dynCast<Select>()) {
      select->ifTrue = optimizeBoolean(select->ifTrue);
      select->ifFalse = optimizeBoolean(select->ifFalse);
    } else if (auto* tryy = boolean->dynCast<Try>()) {
      if (tryy->type == Type::i32) {
        tryy->body = optimizeBoolean(tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = optimizeBoolean(tryy->catchBodies[i]);
        }
      }
    }
    // TODO: recurse into br values?
    return boolean;
  }